

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_creation_date(jx9_context *pCtx,int argc,jx9_value **argv)

{
  char *pcVar1;
  unqlite_col *puVar2;
  int iFlag;
  int nByte;
  SyString sName;
  
  if (argc < 1) {
    pcVar1 = "Missing collection name";
  }
  else {
    pcVar1 = jx9_value_to_string(*argv,&nByte);
    if (0 < nByte) {
      sName.nByte = nByte;
      sName.zString = pcVar1;
      puVar2 = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
      if (puVar2 != (unqlite_col *)0x0) {
        jx9_result_string_format
                  (pCtx,"%d-%d-%d %02d:%02d:%02d",(ulong)(uint)(puVar2->sCreation).tm_year,
                   (ulong)(uint)(puVar2->sCreation).tm_mon,(ulong)(uint)(puVar2->sCreation).tm_mday,
                   (ulong)(uint)(puVar2->sCreation).tm_hour,(ulong)(uint)(puVar2->sCreation).tm_min,
                   (ulong)(uint)(puVar2->sCreation).tm_sec);
        return 0;
      }
      goto LAB_001168a5;
    }
    pcVar1 = "Invalid collection name";
  }
  jx9_context_throw_error(pCtx,1,pcVar1);
LAB_001168a5:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_creation_date(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		Sytm *pTm = &pCol->sCreation;
		jx9_result_string_format(pCtx,"%d-%d-%d %02d:%02d:%02d",
			pTm->tm_year,pTm->tm_mon,pTm->tm_mday,
			pTm->tm_hour,pTm->tm_min,pTm->tm_sec
			);
	}else{
		/* No such collection */
		jx9_result_bool(pCtx,0);
	}
	return JX9_OK;
}